

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateTransformFeedbackResourceListBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool reducedSet)

{
  Node *pNVar1;
  StorageQualifier *this;
  TransformFeedbackTarget *pTVar2;
  TestNode *pTVar3;
  Variable *pVVar4;
  ArrayElement *pAVar5;
  SharedPtr xfbTarget;
  SharedPtr variable;
  SharedPtr variable_1;
  SharedPtr output;
  SharedPtr defaultBlock;
  
  pNVar1 = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)pNVar1,parentStructure);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&defaultBlock,pNVar1);
  this = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(this,&defaultBlock,STORAGE_OUT);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&output,(Node *)this);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,&defaultBlock,"gl_Position");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&xfbTarget,(Node *)pTVar2);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,&xfbTarget,"builtin_gl_position");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&xfbTarget);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget(pTVar2,&output,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&xfbTarget,(Node *)pTVar2);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,&xfbTarget,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)pVVar4);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,&variable,"default_block_basic_type");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&xfbTarget);
  pNVar1 = (Node *)operator_new(0x20);
  ResourceDefinition::StructMember::StructMember((StructMember *)pNVar1,&output);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&xfbTarget,pNVar1);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,&xfbTarget,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)pTVar2);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable_1,(Node *)pVVar4);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,&variable_1,
             "default_block_struct_member");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable_1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&xfbTarget);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget(pTVar2,&output,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&xfbTarget,(Node *)pTVar2);
  pAVar5 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar5,&xfbTarget,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)pAVar5);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable_1,(Node *)pVVar4);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,&variable_1,"default_block_array");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable_1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&xfbTarget);
  pAVar5 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar5,&output,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&xfbTarget,(Node *)pAVar5);
  pTVar2 = (TransformFeedbackTarget *)operator_new(0x28);
  ResourceDefinition::TransformFeedbackTarget::TransformFeedbackTarget
            (pTVar2,&xfbTarget,(char *)0x0);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)pTVar2);
  pVVar4 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar4,&variable,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable_1,(Node *)pVVar4);
  pTVar3 = (TestNode *)operator_new(0x98);
  FeedbackResourceListTestCase::FeedbackResourceListTestCase
            ((FeedbackResourceListTestCase *)pTVar3,context,&variable_1,
             "default_block_array_element");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable_1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&xfbTarget);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&output);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&defaultBlock);
  return;
}

Assistant:

static void generateTransformFeedbackResourceListBlockContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool reducedSet)
{
	const ResourceDefinition::Node::SharedPtr	defaultBlock	(new ResourceDefinition::DefaultBlock(parentStructure));
	const ResourceDefinition::Node::SharedPtr	output			(new ResourceDefinition::StorageQualifier(defaultBlock, glu::STORAGE_OUT));

	DE_UNREF(reducedSet);

	// .builtin_gl_position
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget(new ResourceDefinition::TransformFeedbackTarget(defaultBlock, "gl_Position"));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, xfbTarget, "builtin_gl_position"));
	}
	// .default_block_basic_type
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_basic_type"));
	}
	// .default_block_struct_member
	{
		const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(structMbr));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_struct_member"));
	}
	// .default_block_array
	{
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(output));
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(xfbTarget));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_array"));
	}
	// .default_block_array_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(output));
		const ResourceDefinition::Node::SharedPtr xfbTarget	(new ResourceDefinition::TransformFeedbackTarget(arrayElem));
		const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(xfbTarget, glu::TYPE_FLOAT_VEC4));
		targetGroup->addChild(new FeedbackResourceListTestCase(context, variable, "default_block_array_element"));
	}
}